

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_chatglm::llm_build_chatglm
          (llm_build_chatglm *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  undefined8 uVar2;
  int iVar3;
  uint32_t uVar4;
  llm_ffn_op_type type_op;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  const_reference pvVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ggml_tensor *name;
  ggml_tensor *pgVar11;
  ggml_tensor *cur_00;
  ggml_tensor *pgVar12;
  ggml_tensor *pgVar13;
  ggml_tensor *pgVar14;
  pointer plVar15;
  ggml_tensor *pgVar16;
  ggml_tensor *in_RCX;
  long in_RSI;
  ggml_tensor *in_RDI;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_gqa;
  int64_t n_embd_head;
  ggml_type local_2b8;
  uint32_t il_00;
  llama_hparams *in_stack_fffffffffffffd50;
  ggml_tensor *in_stack_fffffffffffffd58;
  ggml_tensor *cur_01;
  ggml_tensor *in_stack_fffffffffffffd60;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffd68;
  undefined4 uVar17;
  llm_graph_context *in_stack_fffffffffffffd70;
  ggml_tensor *in_stack_fffffffffffffda0;
  ggml_tensor *in_stack_fffffffffffffda8;
  ggml_tensor *in_stack_fffffffffffffdb0;
  ggml_tensor *in_stack_fffffffffffffdd0;
  ggml_tensor *in_stack_fffffffffffffdf0;
  ggml_tensor *in_stack_fffffffffffffe00;
  ggml_tensor *down;
  ggml_tensor *down_b;
  ggml_tensor *down_s;
  ggml_tensor *pgVar18;
  llm_ffn_gate_type type_gate;
  int il_01;
  ggml_tensor *in_stack_fffffffffffffe58;
  llm_graph_context *in_stack_fffffffffffffe60;
  ggml_tensor *in_stack_ffffffffffffff10;
  ggml_tensor *in_stack_ffffffffffffff18;
  ggml_tensor *in_stack_ffffffffffffff20;
  ggml_tensor *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff60;
  uint32_t uVar19;
  ggml_tensor *in_stack_ffffffffffffff68;
  ggml_tensor *in_stack_ffffffffffffff70;
  ggml_tensor *local_88;
  ggml_tensor *local_80;
  ggml_tensor *local_78;
  ggml_tensor *local_70;
  int local_64;
  ggml_tensor *local_50;
  ggml_tensor *local_48;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffd60,
             (llm_graph_params *)in_stack_fffffffffffffd58);
  uVar1 = *(uint *)(in_RDI->buffer + 0x24);
  uVar4 = llama_hparams::n_embd_v_gqa(in_stack_fffffffffffffd50,il_00);
  if (uVar1 == *(uint *)(in_RDI->buffer + 0x20)) {
    uVar19 = uVar4;
    local_50 = llm_graph_context::build_inp_embd
                         (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    pgVar14 = local_50;
    pgVar5 = llm_graph_context::build_inp_pos((llm_graph_context *)in_stack_fffffffffffffdb0);
    pgVar6 = (ggml_tensor *)
             llm_graph_context::build_attn_inp_kv_unified
                       ((llm_graph_context *)in_stack_fffffffffffffdf0);
    pgVar16 = pgVar6;
    for (local_64 = 0; (long)local_64 < in_RDI->ne[3]; local_64 = local_64 + 1) {
      local_70 = local_50;
      pgVar13 = local_50;
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_64);
      pgVar7 = llm_graph_context::build_norm
                         (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                          in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                          (llm_norm_type)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                          (int)in_stack_fffffffffffffd50);
      uVar17 = (undefined4)((ulong)in_stack_fffffffffffffd68 >> 0x20);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                 &in_stack_fffffffffffffd50->vocab_only,il_00);
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_64);
      if (pvVar8->wqkv == (ggml_tensor *)0x0) {
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_64);
        local_78 = llm_graph_context::build_lora_mm
                             ((llm_graph_context *)in_stack_fffffffffffffdb0,
                              in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        in_stack_ffffffffffffff28 = local_78;
        pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_64);
        if (pvVar8->bq != (ggml_tensor *)0x0) {
          in_stack_ffffffffffffff10 = in_RDI->src[5];
          pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                             ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0)
                              ,(long)local_64);
          in_stack_ffffffffffffff20 =
               (ggml_tensor *)ggml_add(in_stack_ffffffffffffff10,local_78,pvVar8->bq);
          in_stack_ffffffffffffff18 = local_78;
          local_78 = in_stack_ffffffffffffff20;
        }
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_64);
        local_80 = llm_graph_context::build_lora_mm
                             ((llm_graph_context *)in_stack_fffffffffffffdb0,
                              in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_64);
        if (pvVar8->bk != (ggml_tensor *)0x0) {
          pgVar18 = in_RDI->src[5];
          pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                             ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0)
                              ,(long)local_64);
          local_80 = (ggml_tensor *)ggml_add(pgVar18,local_80,pvVar8->bk);
        }
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_64);
        local_88 = llm_graph_context::build_lora_mm
                             ((llm_graph_context *)in_stack_fffffffffffffdb0,
                              in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_64);
        if (pvVar8->bv != (ggml_tensor *)0x0) {
          pgVar18 = in_RDI->src[5];
          pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                             ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0)
                              ,(long)local_64);
          local_88 = (ggml_tensor *)ggml_add(pgVar18,local_88,pvVar8->bv);
        }
      }
      else {
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_64);
        local_48 = llm_graph_context::build_lora_mm
                             ((llm_graph_context *)in_stack_fffffffffffffdb0,
                              in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                   &in_stack_fffffffffffffd50->vocab_only,il_00);
        pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_64);
        if (pvVar8->bqkv != (ggml_tensor *)0x0) {
          pgVar18 = in_RDI->src[5];
          pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                             ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0)
                              ,(long)local_64);
          local_48 = (ggml_tensor *)ggml_add(pgVar18,local_48,pvVar8->bqkv);
          llm_graph_context::cb
                    ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                     &in_stack_fffffffffffffd50->vocab_only,il_00);
        }
        pgVar18 = in_RDI->src[5];
        uVar10 = ggml_view_2d(pgVar18,local_48,in_RDI->ne[2],(long)*(int *)(in_RDI->src + 2),
                              local_48->nb[1],0);
        local_78 = (ggml_tensor *)ggml_cont(pgVar18,uVar10);
        pgVar18 = in_RDI->src[5];
        uVar10 = ggml_view_2d(pgVar18,local_48,uVar4,(long)*(int *)(in_RDI->src + 2),local_48->nb[1]
                              ,in_RDI->ne[2] << 2);
        local_80 = (ggml_tensor *)ggml_cont(pgVar18,uVar10);
        pgVar18 = in_RDI->src[5];
        uVar10 = ggml_view_2d();
        local_88 = (ggml_tensor *)ggml_cont(pgVar18,uVar10);
      }
      uVar9 = ggml_reshape_3d(in_RDI->src[5],local_78,uVar1,in_RDI->nb[3],
                              (long)*(int *)(in_RDI->src + 2));
      uVar10._0_4_ = in_RDI->op;
      uVar10._4_4_ = in_RDI->op_params[0];
      uVar10 = ggml_reshape_3d(in_RDI->src[5],local_80,uVar1,uVar10,(long)*(int *)(in_RDI->src + 2))
      ;
      uVar2._0_4_ = in_RDI->op;
      uVar2._4_4_ = in_RDI->op_params[0];
      name = (ggml_tensor *)
             ggml_reshape_3d(in_RDI->src[5],local_88,uVar1,uVar2,(long)*(int *)(in_RDI->src + 2));
      local_2b8 = *(ggml_type *)(in_RDI->src + 3);
      type_op = ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],
                              in_RDI->flags,*(undefined4 *)in_RDI->src,
                              *(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],uVar9,pgVar5,0,
                              (int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
      local_2b8 = *(ggml_type *)(in_RDI->src + 3);
      pgVar11 = (ggml_tensor *)
                ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],
                              in_RDI->flags,*(undefined4 *)in_RDI->src,
                              *(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],uVar10,pgVar5,0,
                              (int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
      pgVar18 = pgVar11;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                 &in_stack_fffffffffffffd50->vocab_only,il_00);
      il_01 = (int)pgVar18;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                 &in_stack_fffffffffffffd50->vocab_only,il_00);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                 &in_stack_fffffffffffffd50->vocab_only,il_00);
      down_b = pgVar6;
      down_s = in_RCX;
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_64);
      pgVar18 = pvVar8->wo;
      sqrtf((float)uVar1);
      _local_2b8 = pgVar11;
      pgVar12 = (ggml_tensor *)CONCAT44(uVar17,local_64);
      mw = (ggml_tensor *)0x0;
      cur_01 = (ggml_tensor *)0x0;
      pgVar11 = name;
      down = _local_2b8;
      local_48 = llm_graph_context::build_attn
                           ((llm_graph_context *)pgVar16,(llm_graph_input_attn_kv_unified *)pgVar7,
                            (ggml_cgraph *)pgVar13,in_stack_ffffffffffffff28,
                            in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,pgVar14,in_RDI,
                            (ggml_tensor *)CONCAT44(uVar19,in_stack_ffffffffffffff60),
                            in_stack_ffffffffffffff68,
                            (float)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                            (int)in_stack_ffffffffffffff70);
      pgVar13 = local_48;
      if ((long)local_64 == in_RDI->ne[3] + -1) {
        in_stack_fffffffffffffe00 =
             llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffda0);
        in_stack_ffffffffffffff70 = in_stack_fffffffffffffe00;
        local_48 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_48,in_stack_fffffffffffffe00);
        in_stack_fffffffffffffdf0 =
             (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_50,in_stack_ffffffffffffff70);
        local_70 = in_stack_fffffffffffffdf0;
      }
      type_gate = (llm_ffn_gate_type)pgVar13;
      cur_00 = (ggml_tensor *)ggml_add(in_RDI->src[5],local_48,local_70);
      pgVar13 = _local_2b8;
      il_00 = (uint32_t)((ulong)_local_2b8 >> 0x20);
      iVar3 = il_00;
      _local_2b8 = pgVar13;
      pgVar7 = cur_00;
      llm_graph_context::cb((llm_graph_context *)mw,cur_01,(char *)name,iVar3);
      in_stack_ffffffffffffff68 = pgVar7;
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_64);
      pgVar12 = llm_graph_context::build_norm
                          (in_stack_fffffffffffffd70,pgVar12,mw,cur_01,
                           (llm_norm_type)((ulong)name >> 0x20),(int)name);
      pgVar13 = _local_2b8;
      il_00 = (uint32_t)((ulong)_local_2b8 >> 0x20);
      iVar3 = il_00;
      _local_2b8 = pgVar13;
      llm_graph_context::cb((llm_graph_context *)mw,cur_01,(char *)name,iVar3);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_64);
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_64);
      in_stack_fffffffffffffd58 = pvVar8->ffn_down;
      in_stack_fffffffffffffd70 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffd68 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffd60 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffd50 = (llama_hparams *)0x0;
      local_2b8 = GGML_TYPE_F32;
      il_00 = 0;
      pgVar13 = llm_graph_context::build_ffn
                          ((llm_graph_context *)in_stack_fffffffffffffdf0,cur_00,pgVar12,pgVar7,
                           in_stack_fffffffffffffdd0,(ggml_tensor *)&local_2b8,
                           in_stack_fffffffffffffe00,pgVar11,down,down_b,down_s,pgVar18,type_op,
                           type_gate,il_01);
      in_stack_fffffffffffffdd0 = pgVar13;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                 &in_stack_fffffffffffffd50->vocab_only,il_00);
      local_50 = (ggml_tensor *)ggml_add(in_RDI->src[5],pgVar13,in_stack_ffffffffffffff68);
      in_stack_fffffffffffffdb0 = local_50;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                 &in_stack_fffffffffffffd50->vocab_only,il_00);
    }
    pgVar14 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                         in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                         (llm_norm_type)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                         (int)in_stack_fffffffffffffd50);
    pgVar16 = pgVar14;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               &in_stack_fffffffffffffd50->vocab_only,il_00);
    plVar15 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                        ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                         0x4ef8dd);
    plVar15->t_embd = pgVar14;
    pgVar16 = llm_graph_context::build_lora_mm
                        ((llm_graph_context *)in_stack_fffffffffffffdb0,pgVar16,
                         in_stack_fffffffffffffda0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               &in_stack_fffffffffffffd50->vocab_only,il_00);
    plVar15 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                        ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                         0x4ef962);
    plVar15->t_logits = pgVar16;
    ggml_build_forward_expand(in_RCX,pgVar16);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,0x2a4d,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
}

Assistant:

llm_build_chatglm(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;
        const int64_t n_embd_gqa  = hparams.n_embd_v_gqa();

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            cur = build_norm(inpL,
                    model.layers[il].attn_norm,
                    NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                ggml_tensor * Qcur = nullptr;
                ggml_tensor * Kcur = nullptr;
                ggml_tensor * Vcur = nullptr;

                if (model.layers[il].wqkv == nullptr) {
                    Qcur = build_lora_mm(model.layers[il].wq, cur);
                    if (model.layers[il].bq) {
                        Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    }
                    Kcur = build_lora_mm(model.layers[il].wk, cur);
                    if (model.layers[il].bk) {
                        Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    }
                    Vcur = build_lora_mm(model.layers[il].wv, cur);
                    if (model.layers[il].bv) {
                        Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    }
                } else {
                    cur = build_lora_mm(model.layers[il].wqkv, cur);
                    cb(cur, "wqkv", il);
                    if (model.layers[il].bqkv) {
                        cur = ggml_add(ctx0, cur, model.layers[il].bqkv);
                        cb(cur, "bqkv", il);
                    }
                    Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd,     n_tokens, cur->nb[1], 0*sizeof(float)*(n_embd)));
                    Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd)));
                    Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd + n_embd_gqa)));
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                //printf("freq_base: %f freq_scale: %f ext_factor: %f attn_factor: %f\n", freq_base, freq_scale, ext_factor, attn_factor);
                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            // Add the input
            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // FF
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm,
                        NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        NULL,                      NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SWIGLU, LLM_FFN_SEQ, il);
                cb(cur, "ffn_out", il);

            }

            inpL = ggml_add(ctx0, cur, ffn_inp);
            cb(inpL, "l_out", il);
        }

        cur = build_norm(inpL,
                model.output_norm,
                NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }